

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

void __thiscall icu_63::MeasureUnit::initNoUnit(MeasureUnit *this,char *subtype)

{
  int32_t iVar1;
  int32_t result;
  char *subtype_local;
  MeasureUnit *this_local;
  
  iVar1 = binarySearch((char **)gTypes,0,0x14,"none");
  this->fTypeId = iVar1;
  iVar1 = binarySearch((char **)gSubTypes,*(int32_t *)(gOffsets + (long)this->fTypeId * 4),
                       *(int32_t *)(gOffsets + (long)(this->fTypeId + 1) * 4),subtype);
  this->fSubTypeId = iVar1 - *(int *)(gOffsets + (long)this->fTypeId * 4);
  return;
}

Assistant:

void MeasureUnit::initNoUnit(const char *subtype) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "none");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], subtype);
    U_ASSERT(result != -1);
    fSubTypeId = result - gOffsets[fTypeId];
}